

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O0

void Json_ReadTest(char *pFileName)

{
  Vec_Wec_t *vObjs_00;
  Vec_Wec_t *vObjs;
  Abc_Nam_t *pStrs;
  char *pFileName_local;
  
  pStrs = (Abc_Nam_t *)pFileName;
  vObjs_00 = Json_Read(pFileName,(Abc_Nam_t **)&vObjs);
  if (vObjs_00 != (Vec_Wec_t *)0x0) {
    Json_Write("test.json",(Abc_Nam_t *)vObjs,vObjs_00);
    Abc_NamDeref((Abc_Nam_t *)vObjs);
    Vec_WecFree(vObjs_00);
  }
  return;
}

Assistant:

void Json_ReadTest( char * pFileName )
{
    Abc_Nam_t * pStrs;
    Vec_Wec_t * vObjs;
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return;
    Json_Write( "test.json", pStrs, vObjs );
    Abc_NamDeref( pStrs );
    Vec_WecFree( vObjs );
}